

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O2

bool __thiscall
Trie::matchAll(Trie *this,string *src,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *outVect)

{
  pointer puVar1;
  iterator iVar2;
  mapped_type *pptVar3;
  pointer puVar4;
  trie_node_t *ptVar5;
  uint16_t index;
  Unicode _unicode;
  string temp;
  unsigned_short local_72;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_70;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_68;
  string local_50;
  
  ptVar5 = this->root;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70 = outVect;
  Limonp::utf8ToUnicode(src,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_68);
  puVar1 = local_68._M_impl.super__Vector_impl_data._M_finish;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  puVar4 = local_68._M_impl.super__Vector_impl_data._M_start;
  do {
    if (puVar4 == puVar1) {
      std::__cxx11::string::~string((string *)&local_50);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_68);
      return true;
    }
    local_72 = *puVar4;
    for (; ptVar5 != (mapped_type)0x0; ptVar5 = ptVar5->search_clue) {
      iVar2 = std::
              _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_trie_node_s_*>,_std::_Select1st<std::pair<const_unsigned_short,_trie_node_s_*>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
              ::find(&(ptVar5->nextMap)._M_t,&local_72);
      if ((_Rb_tree_header *)iVar2._M_node != &(ptVar5->nextMap)._M_t._M_impl.super__Rb_tree_header)
      {
        pptVar3 = std::
                  map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
                  ::operator[](&ptVar5->nextMap,&local_72);
        ptVar5 = *pptVar3;
        if (ptVar5 != (mapped_type)0x0) {
          if (ptVar5->infoIndex != -1) {
            local_50._M_string_length = 0;
            *local_50._M_dataplus._M_p = '\0';
            Limonp::unicodeToUtf8
                      ((unsigned_short *)
                       ((long)(puVar4 + 1) -
                       (ulong)((uint)(this->lengthVect).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start[ptVar5->infoIndex] *
                              2)),(const_iterator)(puVar4 + 1),&local_50);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_70,&local_50);
          }
          goto LAB_00107126;
        }
        break;
      }
    }
    ptVar5 = this->root;
LAB_00107126:
    puVar4 = puVar4 + 1;
  } while( true );
}

Assistant:

bool Trie::matchAll(const string &src, vector<string> &outVect)
{
	trie_node_t *node = root;
	uint16_t index;
    Unicode _unicode;
	decode(src, _unicode);
	auto iter = _unicode.begin();
	auto begin = iter, last = iter;
	auto end = _unicode.end();
	string temp;
    for( ; iter != end; iter++ ) {
		index = *iter;
		for ( ; ; ) {
			if ( node == NULL ) {
				break;
			} else if ( node->nextMap.find(index) == node->nextMap.end() ) {
			    node = node->search_clue;
			} else {
				node = node->nextMap[index];
				break;
			}
		}
	    if ( node == NULL ) {
			node = root;
		} else	{
			if ( node->infoIndex != -1 ) {
				temp.clear();
				last = iter - lengthVect[node->infoIndex] + 1;
                encode(last, iter+1 , temp);
                outVect.push_back(temp);
			}
		}
	}
	return true;
}